

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall
Parser::parseExpressionList
          (Parser *this,vector<Expression,_std::allocator<Expression>_> *list,int min,int max)

{
  pointer pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool inUnknownOrFalseBlock;
  Token *token;
  Token *pTVar3;
  ulong uVar4;
  int *args;
  char *text;
  size_type __n;
  bool bVar5;
  int local_70;
  int local_6c;
  Expression local_68;
  Expression local_48;
  
  local_70 = max;
  local_6c = min;
  std::vector<Expression,_std::allocator<Expression>_>::clear(list);
  __n = 0x20;
  if (-1 < max) {
    __n = (size_type)(uint)max;
  }
  std::vector<Expression,_std::allocator<Expression>_>::reserve(list,__n);
  token = Tokenizer::peekToken
                    ((this->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  pCVar1 = (this->conditionStack).
           super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar5 = true;
  if (pCVar1[-1].inTrueBlock == true) {
    bVar5 = pCVar1[-1].inUnknownBlock;
  }
  ::parseExpression(&local_68,
                    (this->entries).
                    super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,bVar5);
  std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&local_68);
  bVar5 = local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0;
  if (!bVar5) {
    printError<>(this,token,"Parameter failure");
    Tokenizer::skipLookahead
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer);
  }
  while( true ) {
    pTVar3 = Tokenizer::peekToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar3->type != Comma) break;
    Tokenizer::eatTokens
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,1);
    pCVar1 = (this->conditionStack).
             super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    inUnknownOrFalseBlock = true;
    if (pCVar1[-1].inTrueBlock == true) {
      inUnknownOrFalseBlock = pCVar1[-1].inUnknownBlock;
    }
    ::parseExpression(&local_48,
                      (this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,inUnknownOrFalseBlock)
    ;
    _Var2._M_pi = local_48.expression.
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    this_00._M_pi =
         local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68.constExpression = local_48.constExpression;
    }
    else {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      local_68.constExpression = local_48.constExpression;
      if (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.expression.
                   super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&local_68);
    if (local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      printError<>(this,token,"Parameter failure");
      bVar5 = false;
      Tokenizer::skipLookahead
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer);
    }
  }
  uVar4 = ((long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar4 < (ulong)(long)min) {
    args = &local_6c;
    text = "Not enough parameters (min %d)";
  }
  else {
    if (uVar4 < (ulong)(long)max || uVar4 - (long)max == 0) goto LAB_00145bf1;
    args = &local_70;
    text = "Too many parameters (max %d)";
  }
  printError<int>(this,token,text,args);
  bVar5 = false;
LAB_00145bf1:
  if (local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.expression.
               super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return bVar5;
}

Assistant:

bool Parser::parseExpressionList(std::vector<Expression>& list, int min, int max)
{
	bool valid = true;
	list.clear();
	list.reserve(max >= 0 ? max : 32);

	const Token& start = peekToken();

	Expression exp = parseExpression();
	list.push_back(exp);

	if (!exp.isLoaded())
	{
		printError(start, "Parameter failure");
		getTokenizer()->skipLookahead();
		valid = false;
	}

	while (peekToken().type == TokenType::Comma)
	{
		eatToken();

		exp = parseExpression();
		list.push_back(exp);

		if (!exp.isLoaded())
		{
			printError(start, "Parameter failure");
			getTokenizer()->skipLookahead();
			valid = false;
		}
	}

	if (list.size() < (size_t) min)
	{
		printError(start, "Not enough parameters (min %d)",min);
		return false;
	}

	if (max != -1 && (size_t) max < list.size())
	{
		printError(start, "Too many parameters (max %d)",max);
		return false;
	}

	return valid;
}